

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

int Dch_ObjCheckTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  
  if (pObj != (Aig_Obj_t *)0x0) {
    while (((uint)*(ulong *)&pObj->field_0x18 & 7) != 2) {
      if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
        return 1;
      }
      if (pObj->TravId == p->nTravIds) {
        return 0;
      }
      pObj->TravId = p->nTravIds;
      iVar1 = Dch_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = Dch_ObjCheckTfi_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      if (iVar1 != 0) {
        return 1;
      }
      if (p->pEquivs == (Aig_Obj_t **)0x0) {
        return 0;
      }
      pObj = p->pEquivs[pObj->Id];
      if (pObj == (Aig_Obj_t *)0x0) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Dch_ObjCheckTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    // check the trivial cases
    if ( pObj == NULL )
        return 0;
    if ( Aig_ObjIsCi(pObj) )
        return 0;
    if ( pObj->fMarkA )
        return 1;
    // skip the visited node
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pObj );
    // check the children
    if ( Dch_ObjCheckTfi_rec( p, Aig_ObjFanin0(pObj) ) )
        return 1;
    if ( Dch_ObjCheckTfi_rec( p, Aig_ObjFanin1(pObj) ) )
        return 1;
    // check equivalent nodes
    return Dch_ObjCheckTfi_rec( p, Aig_ObjEquiv(p, pObj) );
}